

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_avoid(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  char *pcVar7;
  char *pcVar8;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  char *pcVar9;
  int diff;
  int roll;
  int encumb;
  int str;
  int dexa;
  int dex;
  char *attack;
  char buf2 [4608];
  char buf1 [4608];
  float chance;
  undefined4 in_stack_ffffffffffffdba8;
  int in_stack_ffffffffffffdbac;
  int in_stack_ffffffffffffdbb0;
  float in_stack_ffffffffffffdbb4;
  float fVar10;
  undefined4 in_stack_ffffffffffffdbb8;
  undefined4 in_stack_ffffffffffffdbbc;
  int in_stack_ffffffffffffdbc0;
  int in_stack_ffffffffffffdbc4;
  char local_2428 [4];
  int in_stack_ffffffffffffdbdc;
  CHAR_DATA *in_stack_ffffffffffffdbe0;
  int in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc8b;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  char local_1228 [4616];
  float local_20 [2];
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = is_awake(in_RSI);
  if (bVar1) {
    iVar3 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
    if (iVar3 == 0) {
      local_1 = false;
    }
    else {
      iVar3 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
      local_20[0] = (float)((iVar3 * 3) / 10);
      iVar3 = get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
      iVar4 = get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
      if (iVar3 < 6) {
        local_20[0] = local_20[0] + 0.0;
      }
      else {
        if (iVar3 < 0xb) {
          iVar5 = iVar3 / 2;
        }
        else if (iVar3 < 0x10) {
          iVar5 = (iVar3 << 1) / 3;
        }
        else {
          iVar5 = iVar3;
          if (iVar3 < 0x15) {
            iVar5 = (iVar3 << 3) / 10;
          }
        }
        local_20[0] = (float)iVar5 + local_20[0];
      }
      local_20[0] = (float)(((int)local_10->size - (int)local_18->size) * 5) +
                    (float)(iVar3 - iVar4) + local_20[0];
      bVar1 = is_affected_room(local_10->in_room,(int)gsn_blanket);
      if (bVar1) {
        local_20[0] = local_20[0] * 0.8;
      }
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
      if (((!bVar1) && (iVar5 = check_posture(local_10), iVar5 == -1)) &&
         (bVar1 = style_check(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1)) {
        local_20[0] = local_20[0] + 20.0;
      }
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
      if (!bVar1) {
        iVar5 = check_posture(local_18);
        if ((iVar5 == -1) &&
           (bVar1 = style_check(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1)) {
          local_20[0] = local_20[0] + 20.0;
        }
        iVar5 = check_posture(local_18);
        if ((iVar5 == 1) &&
           (bVar1 = style_check(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1)) {
          local_20[0] = local_20[0] - 20.0;
        }
      }
      bVar1 = check_entwine(local_18,2);
      if (bVar1) {
        local_20[0] = local_20[0] / 2.0;
      }
      bVar1 = is_affected(local_18,(int)gsn_creeping_tomb);
      if (bVar1) {
        local_20[0] = local_20[0] * 0.75;
      }
      bVar1 = is_shifted(local_18);
      if (bVar1) {
        iVar5 = get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
        local_20[0] = (float)iVar5 * 2.5;
        bVar1 = is_affected_by((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                               (int)in_stack_ffffffffffffdbb4);
        if (bVar1) {
          local_20[0] = local_20[0] * 1.1;
        }
        bVar1 = is_affected_by((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                               (int)in_stack_ffffffffffffdbb4);
        if (bVar1) {
          local_20[0] = local_20[0] * 0.65;
        }
      }
      local_20[0] = local_20[0] + (float)(int)local_10->defense_mod;
      sVar2 = get_hitroll((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8)
                         );
      local_20[0] = (1.0 - (float)(int)sVar2 / 250.0) * local_20[0];
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
      if (!bVar1) {
        in_stack_ffffffffffffdbc0 =
             armor_weight((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8)
                         );
        in_stack_ffffffffffffdbc4 =
             get_curr_stat(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc);
        local_20[0] = ((float)(((in_stack_ffffffffffffdbc4 + -0x12) * 10 + 300) -
                              in_stack_ffffffffffffdbc0) / 250.0) * local_20[0];
        if (local_20[0] < 0.0) {
          local_20[0] = 0.0;
        }
      }
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
      if ((bVar1) ||
         (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8))
         , bVar1)) {
        local_20[0] = (float)((int)local_18->level - (int)local_10->level) + local_20[0];
      }
      iVar5 = (int)local_10->size - (int)local_18->size;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      local_20[0] = ((float)(int)local_10->balance +
                    ((local_20[0] - (float)(iVar5 * 5)) - (float)(int)local_18->balance)) -
                    (float)local_10->analyze;
      if (local_18->analyzePC == local_10) {
        local_20[0] = (float)local_18->analyze + local_20[0];
      }
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8));
      if ((!bVar1) &&
         (bVar1 = style_check(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdbac), bVar1)) {
        iVar3 = check_evasion((CHAR_DATA *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffdbc4);
        local_20[0] = (float)iVar3 + local_20[0];
      }
      fVar10 = 75.0;
      pfVar6 = std::min<float>(local_20,(float *)&stack0xffffffffffffdbb4);
      local_20[0] = *pfVar6;
      iVar3 = number_percent();
      if ((float)iVar3 < local_20[0]) {
        iVar4 = (int)local_20[0] - iVar3;
        pcVar7 = get_dam_message((CHAR_DATA *)CONCAT44(fVar10,in_stack_ffffffffffffdbb0),
                                 in_stack_ffffffffffffdbac);
        pcVar8 = "";
        if (iVar4 < 0xf) {
          pcVar8 = "barely ";
        }
        pcVar9 = "";
        if (0x32 < iVar4) {
          pcVar9 = " with ease";
        }
        sprintf(local_1228,"You %savoid $n\'s %s%s.",pcVar8,pcVar7,pcVar9);
        pcVar8 = "";
        if (iVar4 < 0xf) {
          pcVar8 = "barely ";
        }
        pcVar9 = "";
        if (0x32 < iVar4) {
          pcVar9 = " with ease";
        }
        sprintf(local_2428,"$N %savoids your %s%s.",pcVar8,pcVar7,pcVar9);
        act((char *)CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),
            (CHAR_DATA *)CONCAT44(iVar3,iVar4),(void *)CONCAT44(fVar10,in_stack_ffffffffffffdbb0),
            (void *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8),0);
        act((char *)CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),
            (CHAR_DATA *)CONCAT44(iVar3,iVar4),(void *)CONCAT44(fVar10,in_stack_ffffffffffffdbb0),
            (void *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8),0);
        check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                      (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_avoid(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	float chance;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	int dex, dexa, str;
	int encumb;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	if (get_skill(ch, gsn_avoid) == 0)
		return false;

	chance = (3 * get_skill(victim, gsn_avoid) / 10);

	dex = get_curr_stat(victim, STAT_DEX);
	dexa = get_curr_stat(ch, STAT_DEX);

	if (dex <= 5)
		chance += 0;
	else if (dex <= 10)
		chance += dex / 2;
	else if (dex <= 15)
		chance += (2 * dex / 3);
	else if (dex <= 20)
		chance += (8 * dex / 10);
	else
		chance += dex;

	chance += dex - dexa;
	chance += (ch->size - victim->size) * 5;

	if (is_affected_room(ch->in_room, gsn_blanket))
		chance *= 0.8;

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;

		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (check_entwine(victim, 2))
		chance /= 2;

	if (is_affected(victim, gsn_creeping_tomb))
		chance *= 0.75;

	if (is_shifted(victim))
	{
		chance = get_curr_stat(victim, STAT_DEX) * 2.5;

		if (is_affected_by(victim, AFF_HASTE))
			chance *= 1.1;

		if (is_affected_by(victim, AFF_SLOW))
			chance *= .65;
	}

	chance += ch->defense_mod;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim))
	{
		encumb = armor_weight(victim);
		str = get_curr_stat(victim, STAT_STR);
		chance *= (float)(300 + (10 * (str - 18)) - encumb) / (float)250;

		if (chance < 0)
			chance = 0;
	}

	if (is_npc(victim) || is_npc(ch))
		chance += (victim->level - ch->level);

	chance -= 5 * abs((ch->size - victim->size));
	chance -= victim->balance;
	chance += ch->balance;

	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim))
	{
		if (style_check(gsn_evasion, victim->pcdata->style))
			chance += check_evasion(victim, (int)chance);
	}

	chance = std::min(chance, (float)75);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)chance - roll;

	attack = get_dam_message(ch, dt);

	sprintf(buf1, "You %savoid $n's %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");
	sprintf(buf2, "$N %savoids your %s%s.", (diff < 15) ? "barely " : "", attack, (diff > 50) ? " with ease" : "");

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);

	check_improve(victim, gsn_avoid, true, 5);

	return true;
}